

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

int __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0>::Get
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0> *this,uint inputChar)

{
  uint inputChar_local;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0> *this_local;
  
  if (this->map[0] == inputChar) {
    this_local._4_4_ = this->lastOcc[0];
  }
  else if (this->map[1] == inputChar) {
    this_local._4_4_ = this->lastOcc[1];
  }
  else if (this->map[2] == inputChar) {
    this_local._4_4_ = this->lastOcc[2];
  }
  else if (this->map[3] == inputChar) {
    this_local._4_4_ = this->lastOcc[3];
  }
  else {
    this_local._4_4_ = this->defv;
  }
  return this_local._4_4_;
}

Assistant:

inline V Get(uint inputChar) const
        {
            if (map[0] == inputChar)
                return lastOcc[0];
            if (map[1] == inputChar)
                return lastOcc[1];
            if (map[2] == inputChar)
                return lastOcc[2];
            if (map[3] == inputChar)
                return lastOcc[3];
            return defv;
        }